

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode ipv6_parse(Curl_URL *u,char *hostname,size_t hlen)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char *__s;
  size_t sVar7;
  char *pcVar8;
  char zoneid [16];
  char dest [16];
  char local_68 [48];
  undefined1 local_38 [16];
  
  if (hlen < 4) {
    return CURLUE_BAD_IPV6;
  }
  __s = hostname + 1;
  sVar4 = strspn(__s,"0123456789abcdefABCDEF:.");
  sVar7 = hlen - 2;
  if (hlen - 2 == sVar4) goto LAB_0016326c;
  if (__s[sVar4] != '%') {
    return CURLUE_BAD_IPV6;
  }
  pcVar8 = __s + sVar4;
  pcVar5 = pcVar8 + 1;
  cVar2 = pcVar8[1];
  if (pcVar8[1] == '2') {
    cVar2 = '2';
    if (((pcVar8[2] == '5') && (cVar1 = pcVar8[3], cVar1 != '\0')) && (cVar1 != ']')) {
      pcVar5 = pcVar8 + 3;
      cVar2 = cVar1;
      goto LAB_00163317;
    }
  }
  else {
LAB_00163317:
    if (cVar2 == '\0') {
      return CURLUE_BAD_IPV6;
    }
  }
  uVar6 = 0;
  while ((cVar2 != ']' && (uVar6 < 0xf))) {
    local_68[uVar6] = cVar2;
    cVar2 = pcVar5[uVar6 + 1];
    uVar6 = uVar6 + 1;
    if (cVar2 == '\0') {
      return CURLUE_BAD_IPV6;
    }
  }
  if (uVar6 == 0) {
    return CURLUE_BAD_IPV6;
  }
  if (cVar2 != ']') {
    return CURLUE_BAD_IPV6;
  }
  local_68[uVar6] = '\0';
  pcVar5 = (*Curl_cstrdup)(local_68);
  u->zoneid = pcVar5;
  if (pcVar5 == (char *)0x0) {
    return CURLUE_OUT_OF_MEMORY;
  }
  pcVar8[0] = ']';
  pcVar8[1] = '\0';
  sVar7 = sVar4;
LAB_0016326c:
  __s[sVar7] = '\0';
  iVar3 = inet_pton(10,__s,local_38);
  if (iVar3 == 1) {
    pcVar5 = inet_ntop(10,local_38,local_68,0x2e);
    if ((pcVar5 != (char *)0x0) && (sVar4 = strlen(local_68), sVar4 < sVar7)) {
      strcpy(__s,local_68);
      hostname[sVar4 + 2] = '\0';
      sVar7 = sVar4;
    }
    __s[sVar7] = ']';
    return CURLUE_OK;
  }
  return CURLUE_BAD_IPV6;
}

Assistant:

static CURLUcode ipv6_parse(struct Curl_URL *u, char *hostname,
                            size_t hlen) /* length of hostname */
{
  size_t len;
  DEBUGASSERT(*hostname == '[');
  if(hlen < 4) /* '[::]' is the shortest possible valid string */
    return CURLUE_BAD_IPV6;
  hostname++;
  hlen -= 2;

  /* only valid IPv6 letters are ok */
  len = strspn(hostname, "0123456789abcdefABCDEF:.");

  if(hlen != len) {
    hlen = len;
    if(hostname[len] == '%') {
      /* this could now be '%[zone id]' */
      char zoneid[16];
      int i = 0;
      char *h = &hostname[len + 1];
      /* pass '25' if present and is a URL encoded percent sign */
      if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
        h += 2;
      while(*h && (*h != ']') && (i < 15))
        zoneid[i++] = *h++;
      if(!i || (']' != *h))
        return CURLUE_BAD_IPV6;
      zoneid[i] = 0;
      u->zoneid = strdup(zoneid);
      if(!u->zoneid)
        return CURLUE_OUT_OF_MEMORY;
      hostname[len] = ']'; /* insert end bracket */
      hostname[len + 1] = 0; /* terminate the hostname */
    }
    else
      return CURLUE_BAD_IPV6;
    /* hostname is fine */
  }

  /* Check the IPv6 address. */
  {
    char dest[16]; /* fits a binary IPv6 address */
    char norm[MAX_IPADR_LEN];
    hostname[hlen] = 0; /* end the address there */
    if(1 != Curl_inet_pton(AF_INET6, hostname, dest))
      return CURLUE_BAD_IPV6;

    /* check if it can be done shorter */
    if(Curl_inet_ntop(AF_INET6, dest, norm, sizeof(norm)) &&
       (strlen(norm) < hlen)) {
      strcpy(hostname, norm);
      hlen = strlen(norm);
      hostname[hlen + 1] = 0;
    }
    hostname[hlen] = ']'; /* restore ending bracket */
  }
  return CURLUE_OK;
}